

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitElse(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  size_t sVar1;
  size_t sVar2;
  ScopeCtx *pSVar3;
  Expression **ppEVar4;
  mapped_type *this_00;
  uint *puVar5;
  ScopeCtx local_238;
  If *local_188;
  Err local_180;
  Err *local_160;
  Err *err;
  Result<wasm::Expression_*> _val;
  Result<wasm::Expression_*> expr;
  Err local_100;
  If *local_d0;
  If *iff;
  ScopeCtx scope;
  IRBuilder *this_local;
  
  scope.startPos = (size_t)this;
  pSVar3 = getScope(this);
  ScopeCtx::ScopeCtx((ScopeCtx *)&iff,pSVar3);
  local_d0 = ScopeCtx::getIf((ScopeCtx *)&iff);
  if (local_d0 == (If *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"unexpected else",
               (allocator<char> *)
               ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x27));
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_100);
    wasm::Err::~Err(&local_100);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x27));
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index = '\x01';
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._33_3_ = 0;
  }
  else {
    finishScope((Result<wasm::Expression_*> *)
                ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),this,
                (Block *)0x0);
    Result<wasm::Expression_*>::Result
              ((Result<wasm::Expression_*> *)&err,
               (Result<wasm::Expression_*> *)
               ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
    local_160 = Result<wasm::Expression_*>::getErr((Result<wasm::Expression_*> *)&err);
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index = local_160 != (Err *)0x0;
    if ((bool)expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
              super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
              super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
              super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index) {
      wasm::Err::Err(&local_180,local_160);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_180);
      wasm::Err::~Err(&local_180);
    }
    expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
    super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
    super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
    super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._33_3_ = 0;
    Result<wasm::Expression_*>::~Result((Result<wasm::Expression_*> *)&err);
    if (expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
        super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
        super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
        super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._32_4_ == 0) {
      ppEVar4 = Result<wasm::Expression_*>::operator*
                          ((Result<wasm::Expression_*> *)
                           ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      local_d0->ifTrue = *ppEVar4;
      if ((this->binaryPos != (size_t *)0x0) && (this->func != (Function *)0x0)) {
        sVar1 = this->lastBinaryPos;
        sVar2 = this->codeSectionOffset;
        local_188 = local_d0;
        this_00 = std::
                  unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
                  ::operator[](&this->func->delimiterLocations,(key_type *)&local_188);
        puVar5 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](this_00,0);
        *puVar5 = (int)sVar1 - (int)sVar2;
      }
      ScopeCtx::makeElse(&local_238,(ScopeCtx *)&iff);
      pushScope(__return_storage_ptr__,this,&local_238);
      ScopeCtx::~ScopeCtx(&local_238);
      expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._M_index = '\x01';
      expr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err>.
      super__Variant_storage_alias<wasm::Expression_*,_wasm::Err>._33_3_ = 0;
    }
    Result<wasm::Expression_*>::~Result
              ((Result<wasm::Expression_*> *)
               ((long)&_val.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
  }
  ScopeCtx::~ScopeCtx((ScopeCtx *)&iff);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitElse() {
  auto scope = getScope();
  auto* iff = scope.getIf();
  if (!iff) {
    return Err{"unexpected else"};
  }
  auto expr = finishScope();
  CHECK_ERR(expr);
  iff->ifTrue = *expr;

  if (binaryPos && func) {
    func->delimiterLocations[iff][BinaryLocations::Else] =
      lastBinaryPos - codeSectionOffset;
  }

  return pushScope(ScopeCtx::makeElse(std::move(scope)));
}